

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SignalEventControl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SignalEventControl,slang::ast::EdgeKind_const&,slang::ast::Expression_const&,slang::ast::Expression_const*const&,slang::SourceRange_const&>
          (BumpAllocator *this,EdgeKind *args,Expression *args_1,Expression **args_2,
          SourceRange *args_3)

{
  SourceRange sourceRange;
  SignalEventControl *pSVar1;
  SignalEventControl *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  BumpAllocator *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pSVar1 = (SignalEventControl *)allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
  ;
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::SignalEventControl::SignalEventControl
            (in_RCX,(EdgeKind)((ulong)in_R8 >> 0x20),(Expression *)in_R8->endPtr,
             (Expression *)in_R8->head,sourceRange);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }